

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

bool __thiscall QFormLayout::isRowVisible(QFormLayout *this,QLayout *layout)

{
  bool bVar1;
  long in_FS_OFFSET;
  ItemRole role;
  int row;
  char local_48 [24];
  char *local_30;
  ItemRole local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QLayoutPrivate::checkLayout(*(QLayoutPrivate **)&(this->super_QLayout).field_0x8,layout);
  if (bVar1) {
    local_24 = -0x55555556;
    local_28 = 0xaaaaaaaa;
    getLayoutPosition(this,layout,&local_24,&local_28);
    if (local_24 < 0) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_30 = "default";
      bVar1 = false;
      QMessageLogger::warning(local_48,"QFormLayout::takeRow: Invalid layout");
    }
    else {
      bVar1 = isRowVisible(this,local_24);
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFormLayout::isRowVisible(QLayout *layout) const
{
    Q_D(const QFormLayout);
    if (Q_UNLIKELY(!d->checkLayout(layout)))
        return false;
    int row;
    ItemRole role;
    getLayoutPosition(layout, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::takeRow: Invalid layout");
        return false;
    }

    return isRowVisible(row);
}